

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture2DProj3OffsetBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  Texture2D *pTVar2;
  int i;
  long lVar3;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  undefined8 local_48;
  ulong uStack_40;
  float local_38 [6];
  
  fVar1 = c->in[0].m_data[2];
  local_48 = *(undefined8 *)(p->offset).m_data;
  pTVar2 = c->textures[0].tex2D;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  tcu::sampleLevelArray2DOffset
            ((ConstPixelBufferAccess *)&stack0xffffffffffffffe0,(int)(pTVar2->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar2->m_view).m_numLevels,c->in[0].m_data[0] / fVar1,
             c->in[0].m_data[1] / fVar1,p->lod + c->in[1].m_data[0],(IVec3 *)c->textures);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  lVar3 = 0;
  do {
    local_38[lVar3] = *(float *)(&stack0xffffffffffffffe0 + lVar3 * 4) * (p->scale).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_48 + lVar3 * 4) = local_38[lVar3] + (p->bias).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  *(undefined8 *)(c->color).m_data = local_48;
  *(ulong *)((c->color).m_data + 2) = uStack_40;
  return;
}

Assistant:

static void		evalTexture2DProj3OffsetBias	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), p.lod+c.in[1].x(), p.offset.swizzle(0,1))*p.scale + p.bias; }